

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O2

void print<vm::Instruction>(ostream *out,Instruction *t)

{
  mapped_type *ppcVar1;
  const_iterator cVar2;
  long lVar3;
  mapped_type pcVar4;
  char *name;
  mapped_type local_20;
  
  ppcVar1 = std::__detail::
            _Map_base<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<vm::OpCode,_std::pair<const_vm::OpCode,_const_char_*>,_std::allocator<std::pair<const_vm::OpCode,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)vm::nameOfOpCode,&t->op);
  pcVar4 = *ppcVar1;
  local_20 = pcVar4;
  cVar2 = std::
          _Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<vm::OpCode,_std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<vm::OpCode>,_std::hash<vm::OpCode>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)vm::paramSizeOfOpCode,&t->op);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
LAB_0011351d:
    std::operator<<(out,pcVar4);
    return;
  }
  lVar3 = *(long *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
                          ._M_cur + 0x18) -
          *(long *)((long)cVar2.
                          super__Node_iterator_base<std::pair<const_vm::OpCode,_std::vector<int,_std::allocator<int>_>_>,_false>
                          ._M_cur + 0x10) >> 2;
  if (lVar3 == 2) {
    printfmt<char_const*,unsigned_int,unsigned_int>(out,"{} {},{}",&local_20,&t->x,&t->y);
  }
  else {
    if (lVar3 != 1) {
      if (lVar3 != 0) {
        pcVar4 = "????";
      }
      goto LAB_0011351d;
    }
    print<char_const*,unsigned_int>(out,&local_20,&t->x);
  }
  return;
}

Assistant:

inline void print(std::ostream& out, const vm::Instruction& t) {
    const char* name = vm::nameOfOpCode.at(t.op); 
    if (auto it = vm::paramSizeOfOpCode.find(t.op); it != vm::paramSizeOfOpCode.end()) {
        switch (it->second.size()) {
        case 0: print(out, name); break;
        case 1: print(out, name, t.x); break;
        case 2: printfmt(out, "{} {},{}", name, t.x, t.y); break;
        default: print(out, "????"); break;
        }
    }
    else {
        print(out, name);
    }
}